

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_DeclarationBinder.cpp
# Opt level: O0

void __thiscall
psy::C::DeclarationBinder::DiagnosticsReporter::TypeSpecifierMissingDefaultsToInt
          (DiagnosticsReporter *this,SyntaxToken *declTk)

{
  SyntaxToken local_138;
  allocator<char> local_f9;
  string local_f8 [55];
  allocator<char> local_c1;
  string local_c0 [32];
  string local_a0 [32];
  DiagnosticDescriptor local_80;
  SyntaxToken *local_18;
  SyntaxToken *declTk_local;
  DiagnosticsReporter *this_local;
  
  local_18 = declTk;
  declTk_local = (SyntaxToken *)this;
  std::__cxx11::string::string
            (local_a0,(string *)&ID_of_TypeSpecifierMissingDefaultsToInt_abi_cxx11_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,"[[type specifier missing]]",&local_c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"type specifier missing, defaults to `int\'",&local_f9);
  psy::DiagnosticDescriptor::DiagnosticDescriptor(&local_80,local_a0,local_c0,local_f8,2);
  local_138.field_10 = declTk->field_10;
  local_138.tree_ = declTk->tree_;
  local_138.syntaxK_ = declTk->syntaxK_;
  local_138.byteSize_ = declTk->byteSize_;
  local_138.charSize_ = declTk->charSize_;
  local_138._14_2_ = *(undefined2 *)&declTk->field_0xe;
  local_138.byteOffset_ = declTk->byteOffset_;
  local_138.charOffset_ = declTk->charOffset_;
  local_138.matchingBracket_ = declTk->matchingBracket_;
  local_138.field_7 = declTk->field_7;
  local_138._34_2_ = *(undefined2 *)&declTk->field_0x22;
  local_138.lineno_ = declTk->lineno_;
  local_138.column_ = declTk->column_;
  local_138._44_4_ = *(undefined4 *)&declTk->field_0x2c;
  diagnose(this,&local_80,&local_138);
  SyntaxToken::~SyntaxToken(&local_138);
  DiagnosticDescriptor::~DiagnosticDescriptor(&local_80);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator(&local_c1);
  std::__cxx11::string::~string(local_a0);
  return;
}

Assistant:

void DeclarationBinder::DiagnosticsReporter::TypeSpecifierMissingDefaultsToInt(SyntaxToken declTk)
{
    diagnose(DiagnosticDescriptor(
                 ID_of_TypeSpecifierMissingDefaultsToInt,
                 "[[type specifier missing]]",
                 "type specifier missing, defaults to `int'",
                 DiagnosticSeverity::Error,
                 DiagnosticCategory::Binding),
             declTk);
}